

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_logger.cpp
# Opt level: O3

void __thiscall
ot::commissioner::SysLogger::Log(SysLogger *this,LogLevel aLevel,string *aRegion,string *aMsg)

{
  char *pcVar1;
  int __pri;
  string ret;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  if (aLevel <= this->mLogLevel) {
    switch(aLevel) {
    case kOff:
      pcVar1 = "[ off   ]";
      __pri = 0;
      break;
    case kCritical:
      pcVar1 = "[ crit  ]";
      __pri = 2;
      break;
    case kError:
      pcVar1 = "[ error ]";
      __pri = 3;
      break;
    case kWarn:
      pcVar1 = "[ warn  ]";
      __pri = 4;
      break;
    case kInfo:
      pcVar1 = "[ info  ]";
      __pri = 6;
      break;
    case kDebug:
      pcVar1 = "[ debug ]";
      __pri = 7;
      break;
    default:
      abort();
    }
    local_38 = 0;
    local_30[0] = 0;
    local_40 = local_30;
    std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)pcVar1);
    syslog(__pri,"%s [ %s ] %s",local_40,(aRegion->_M_dataplus)._M_p,(aMsg->_M_dataplus)._M_p);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return;
}

Assistant:

void SysLogger::Log(LogLevel aLevel, const std::string &aRegion, const std::string &aMsg)
{
    if (aLevel <= mLogLevel)
    {
        syslog(ToSysLogLevel(aLevel), "%s [ %s ] %s", ToString(aLevel).c_str(), aRegion.c_str(), aMsg.c_str());
    }
}